

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestresetOnEndTimeFixtureresetOnEndTime::TestresetOnEndTimeFixtureresetOnEndTime
          (TestresetOnEndTimeFixtureresetOnEndTime *this)

{
  char *suiteName;
  TestresetOnEndTimeFixtureresetOnEndTime *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"resetOnEndTime",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x571);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestresetOnEndTimeFixtureresetOnEndTime_0045a570;
  return;
}

Assistant:

TEST_FIXTURE(resetOnEndTimeFixture, resetOnEndTime)
{
  createSession();
  UtcTimeStamp timeStamp = startTimeStamp;
  object->next( createLogon( "ISLD", "TW", 1 ), timeStamp );
  object->next( createHeartbeat( "ISLD", "TW", 2 ), timeStamp );

  CHECK_EQUAL( 1, toLogon );
  CHECK_EQUAL( 0, disconnected );
  timeStamp += 1;
  object->next( timeStamp );
  CHECK_EQUAL( 0, disconnected );
  timeStamp += 2;
  object->next( timeStamp );
  CHECK_EQUAL( 1, disconnected );
  CHECK_EQUAL( 1, toLogout );
  CHECK_EQUAL( 1, object->getExpectedSenderNum() );
  CHECK_EQUAL( 1, object->getExpectedTargetNum() );
}